

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O0

void mcmcswf(mcmcx1def *ctx,mcmon objn,mcsseg swapn,mcsseg oldswapn)

{
  mcmodef *pmVar1;
  uint uVar2;
  mcmodef *o;
  mcsseg oldswapn_local;
  mcsseg swapn_local;
  mcmon objn_local;
  mcmcx1def *ctx_local;
  
  pmVar1 = ctx->mcmcxtab[(int)(uint)objn >> 8];
  uVar2 = objn & 0xff;
  if ((((pmVar1[(int)uVar2].mcmoflg & 3) != 0) && (pmVar1[(int)uVar2].mcmoloc.mcmolocs == oldswapn))
     || ((pmVar1[(int)uVar2].mcmoflg & 8) != 0)) {
    pmVar1[(int)uVar2].mcmoloc.mcmolocs = swapn;
  }
  return;
}

Assistant:

void mcmcswf(mcmcx1def *ctx, mcmon objn, mcsseg swapn, mcsseg oldswapn)
{
    mcmodef *o = mcmgobje(ctx, objn);
    
    MCMGLBCTX(ctx);
    
    /*
     *   Reset the swap number only if the object is swapped out and its
     *   swap file number matches the old one, or the object is currently
     *   present (in which case the swap file number is irrelevant and can
     *   be replaced).  
     */
    if (((o->mcmoflg & (MCMOFDIRTY | MCMOFNODISC)) && o->mcmoswh == oldswapn)
        || (o->mcmoflg & MCMOFPRES))
        o->mcmoswh = swapn;
}